

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSetInner::ToComplement
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint base,
          CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  Char lc;
  Char hc;
  uint uVar4;
  undefined4 *puVar5;
  uint u;
  uint i;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)base;
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x228,"(level > 0)","level > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar4 = -1 << ((char)level * '\x04' + 4U & 0x1f);
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    pCVar1 = this->children[lVar6];
    uVar7 = (uint)uVar8;
    if (pCVar1 == (CharSetNode *)0x0) {
      u = 0x100;
      if (0x100 < uVar7) {
        u = uVar7;
      }
      lc = Chars<char16_t>::UTC(u);
      hc = Chars<char16_t>::UTC(~uVar4 + uVar7);
      CharSet<char16_t>::SetRange(result,allocator,lc,hc);
    }
    else {
      (*pCVar1->_vptr_CharSetNode[6])(pCVar1,allocator,(ulong)(level - 1),uVar8,result);
    }
    uVar8 = (ulong)(uVar7 - uVar4);
  }
  return;
}

Assistant:

void CharSetInner::ToComplement(ArenaAllocator* allocator, uint level, uint base, CharSet<Char>& result) const
    {
        Assert(level > 0);
        level--;
        uint delta = lim(level) + 1;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] == nullptr)
                // Caution: Part of the range for this child may overlap with direct vector
                result.SetRange(allocator, UTC(max(base, directSize)), UTC(base + delta - 1));
            else
                children[i]->ToComplement(allocator, level, base, result);
            base += delta;
        }
    }